

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::gatherv<TwoBSA<unsigned_long>>
               (TwoBSA<unsigned_long> *data,size_t size,TwoBSA<unsigned_long> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  pointer *ppiVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  TwoBSA<unsigned_long> *pTVar3;
  size_t sVar4;
  int iVar5;
  const_iterator cVar6;
  MPI_Datatype poVar7;
  MPI_Comm poVar8;
  const_iterator __last;
  iterator __result;
  reference pvVar9;
  reference pvVar10;
  MPI_Datatype poVar11;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> displs;
  allocator<int> local_b1;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> counts;
  datatype dt;
  undefined1 local_70 [8];
  datatype mpi_sizet;
  ulong local_48;
  size_t total_size;
  comm *comm_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvStack_30;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  TwoBSA<unsigned_long> *out_local;
  size_t size_local;
  TwoBSA<unsigned_long> *data_local;
  
  total_size = (size_t)comm;
  comm_local._4_4_ = root;
  pvStack_30 = recv_sizes;
  recv_sizes_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)out;
  out_local = (TwoBSA<unsigned_long> *)size;
  size_local = (size_t)data;
  cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(recv_sizes);
  mpi_sizet._16_8_ = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvStack_30);
  iVar5 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )cVar6._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )mpi_sizet._16_8_,0);
  local_48 = (ulong)iVar5;
  get_datatype<unsigned_long>();
  poVar7 = datatype::type((datatype *)local_70);
  iVar5 = comm_local._4_4_;
  poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)total_size);
  MPI_Bcast(&local_48,1,poVar7,iVar5,poVar8);
  if (local_48 < 0x7fffffff) {
    get_datatype<TwoBSA<unsigned_long>>();
    iVar5 = mxx::comm::rank((comm *)total_size);
    sVar4 = size_local;
    pTVar3 = out_local;
    if (iVar5 == comm_local._4_4_) {
      iVar5 = mxx::comm::size((comm *)total_size);
      std::allocator<int>::allocator(&local_b1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_b0,(long)iVar5,&local_b1);
      std::allocator<int>::~allocator(&local_b1);
      cVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvStack_30);
      __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvStack_30);
      __result = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_b0);
      displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )cVar6._M_current,
                               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )__last._M_current,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               __result._M_current);
      impl::get_displacements<int>
                ((vector<int,_std::allocator<int>_> *)local_f0,
                 (vector<int,_std::allocator<int>_> *)local_b0);
      sVar4 = size_local;
      pTVar3 = out_local;
      ppiVar1 = &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      poVar7 = datatype::type((datatype *)ppiVar1);
      pvVar2 = recv_sizes_local;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_b0,0);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_f0,0);
      poVar11 = datatype::type((datatype *)ppiVar1);
      iVar5 = comm_local._4_4_;
      poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)total_size);
      MPI_Gatherv(sVar4,(ulong)pTVar3 & 0xffffffff,poVar7,pvVar2,pvVar9,pvVar10,poVar11,iVar5,poVar8
                 );
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0)
      ;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0)
      ;
    }
    else {
      ppiVar1 = &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      poVar7 = datatype::type((datatype *)ppiVar1);
      poVar11 = datatype::type((datatype *)ppiVar1);
      iVar5 = comm_local._4_4_;
      poVar8 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)total_size);
      MPI_Gatherv(sVar4,(ulong)pTVar3 & 0xffffffff,poVar7,0,0,0,poVar11,iVar5,poVar8);
    }
    datatype::~datatype((datatype *)
                        &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  else {
    impl::gatherv_big<TwoBSA<unsigned_long>>
              ((TwoBSA<unsigned_long> *)size_local,(size_t)out_local,
               (TwoBSA<unsigned_long> *)recv_sizes_local,pvStack_30,comm_local._4_4_,
               (comm *)total_size);
  }
  datatype::~datatype((datatype *)local_70);
  return;
}

Assistant:

void gatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    // tell everybody about the total size
    MPI_Bcast(&total_size, 1, mpi_sizet.type(), root, comm);
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::gatherv_big(data, size, out, recv_sizes, root, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        if (comm.rank() == root) {
            std::vector<int> counts(comm.size());
            std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
            std::vector<int> displs = impl::get_displacements(counts);
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        out, &counts[0], &displs[0], dt.type(), root, comm);
        } else {
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        NULL, NULL, NULL, dt.type(), root, comm);
        }
    }
}